

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

int os_read_dir(osdirhdl_t hdl,char *buf,size_t buflen)

{
  dirent *pdVar1;
  
  pdVar1 = readdir((DIR *)hdl);
  if (pdVar1 != (dirent *)0x0) {
    safe_strcpy(buf,buflen,pdVar1->d_name);
  }
  return (uint)(pdVar1 != (dirent *)0x0);
}

Assistant:

int os_read_dir(osdirhdl_t hdl, char *buf, size_t buflen)
{
    // Read the next directory entry - if we've exhausted the search,
    // return failure.
    struct dirent *d = readdir(hdl);
    if (d == 0)
        return false;

    // return this entry
    safe_strcpy(buf, buflen, d->d_name);
    return true;
}